

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O3

int If_CutPerformCheck07(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  uint uVar1;
  word wVar2;
  byte bVar3;
  word *tLimit;
  uint *puVar4;
  uint uVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  word local_48;
  undefined8 uStack_40;
  
  bVar14 = true;
  if (0 < nLeaves) {
    iVar7 = nVars + -6;
    uVar8 = 1 << ((byte)iVar7 & 0x1f);
    uVar1 = uVar8;
    if ((int)uVar8 < 2) {
      uVar1 = 1;
    }
    uVar9 = 0;
    uVar13 = 0;
    if (0 < nVars) {
      uVar13 = (ulong)(uint)nVars;
    }
    do {
      if (uVar9 == uVar13) {
        __assert_fail("iVar < nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x402,"int Abc_TtHasVar(word *, int, int)");
      }
      if (6 < nVars) {
        if (uVar9 < 6) {
          if (iVar7 != 0x1f) {
            uVar11 = 0;
            while (((*(ulong *)(pTruth + uVar11 * 2) >> ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f) ^
                    *(ulong *)(pTruth + uVar11 * 2)) & s_Truths6Neg[uVar9]) == 0) {
              uVar11 = uVar11 + 1;
              if (uVar1 == uVar11) goto LAB_00392997;
            }
            goto LAB_003928e0;
          }
        }
        else if (iVar7 != 0x1f) {
          bVar3 = (byte)(uVar9 - 6);
          uVar5 = 1 << (bVar3 & 0x1f);
          uVar11 = 1;
          if (1 < (int)uVar5) {
            uVar11 = (ulong)uVar5;
          }
          lVar12 = (long)(2 << (bVar3 & 0x1f));
          puVar4 = pTruth + (long)(int)uVar5 * 2;
          puVar6 = pTruth;
          do {
            if (uVar9 - 6 != 0x1f) {
              uVar10 = 0;
              do {
                if (*(long *)(puVar6 + uVar10 * 2) != *(long *)(puVar4 + uVar10 * 2))
                goto LAB_003928e0;
                uVar10 = uVar10 + 1;
              } while (uVar11 != uVar10);
            }
            puVar6 = puVar6 + lVar12 * 2;
            puVar4 = puVar4 + lVar12 * 2;
          } while (puVar6 < pTruth + (long)(int)uVar8 * 2);
        }
LAB_00392997:
        bVar14 = false;
        goto LAB_00392999;
      }
      if ((s_Truths6Neg[uVar9] &
          (*(ulong *)pTruth >> ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f) ^ *(ulong *)pTruth)) == 0)
      goto LAB_00392997;
LAB_003928e0:
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)nLeaves);
    bVar14 = true;
    if (4 < nLeaves) {
      if (nLeaves == 7) {
        local_48 = *(word *)pTruth;
        uStack_40 = *(undefined8 *)(pTruth + 2);
        wVar2 = If_Dec7Perform(&local_48,0);
      }
      else if (nLeaves == 6) {
        wVar2 = If_Dec6Perform(*(word *)pTruth,0);
      }
      else {
        if (nLeaves != 5) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                        ,0x45b,
                        "int If_CutPerformCheck07(If_Man_t *, unsigned int *, int, int, char *)");
        }
        wVar2 = If_Dec5Perform(CONCAT44(*pTruth,*pTruth),0);
      }
      bVar14 = wVar2 != 0;
    }
  }
LAB_00392999:
  return (int)bVar14;
}

Assistant:

int If_CutPerformCheck07( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
	int fDerive = 0;
    int v;
    // skip non-support minimal
    for ( v = 0; v < nLeaves; v++ )
        if ( !Abc_TtHasVar( (word *)pTruth, nVars, v ) )
            return 0;
    // check
    if ( nLeaves < 5 )
        return 1;
    if ( nLeaves == 5 )
    {
        word z, t = ((word)pTruth[0] << 32) | (word)pTruth[0];
        z = If_Dec5Perform( t, fDerive );
        if ( fDerive && z )
            If_Dec6Verify( t, z );
        return z != 0;
    }
    if ( nLeaves == 6 )
    {
        word z, t = ((word *)pTruth)[0];
        z = If_Dec6Perform( t, fDerive );
        if ( fDerive && z )
        {
//            If_DecPrintConfig( z );
            If_Dec6Verify( t, z );
        }
//        if ( z == 0 )
//            Extra_PrintHex(stdout, (unsigned *)&t, 6), printf( "  " ), Kit_DsdPrintFromTruth( (unsigned *)&t, 6 ), printf( "\n" );
        return z != 0;
    }
    if ( nLeaves == 7 )
    {
        word z, t[2];
        t[0] = ((word *)pTruth)[0];
        t[1] = ((word *)pTruth)[1];
//        if ( If_Dec7CheckMux(t) >= 0 )
//            return 1;
        z = If_Dec7Perform( t, fDerive );
        if ( fDerive && z )
            If_Dec7Verify( t, z );
        return z != 0;
    }
    assert( 0 );
    return 0;
}